

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateEnumOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  long lVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  bool bVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  long *plVar7;
  LogMessage *other;
  long *plVar8;
  size_type *psVar9;
  _Base_ptr p_Var10;
  int iVar11;
  long lVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  string error;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  key_type local_10c;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  EnumDescriptorProto *local_a8;
  DescriptorBuilder *local_a0;
  long *local_98;
  char *local_90;
  long local_88;
  _Alloc_hider _Stack_80;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  iVar11 = 0;
  bVar4 = false;
  local_a0 = this;
  if (0 < *(int *)(enm + 0x2c)) {
    do {
      internal::RepeatedPtrFieldBase::
      Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                (&(proto->value_).super_RepeatedPtrFieldBase,iVar11);
      iVar11 = iVar11 + 1;
    } while (iVar11 < *(int *)(enm + 0x2c));
    bVar4 = 0 < *(int *)(enm + 0x2c);
  }
  if (((*(byte *)(*(long *)(enm + 0x20) + 0x48) & 1) == 0) ||
     (*(char *)(*(long *)(enm + 0x20) + 0x68) == '\0')) {
    p_Var2 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8 = proto;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    if (bVar4) {
      lVar12 = 0;
      do {
        lVar1 = *(long *)(enm + 0x30) + lVar12 * 0x28;
        iVar11 = *(int *)(lVar1 + 0x10);
        p_Var14 = &p_Var2->_M_header;
        p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_002e82ec:
          local_98 = (long *)CONCAT44(local_98._4_4_,iVar11);
          pmVar6 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,(key_type *)&local_98);
          std::__cxx11::string::_M_assign((string *)pmVar6);
        }
        else {
          do {
            p_Var10 = p_Var5;
            p_Var13 = p_Var14;
            _Var3 = p_Var10[1]._M_color;
            p_Var14 = p_Var10;
            if ((int)_Var3 < iVar11) {
              p_Var14 = p_Var13;
            }
            p_Var5 = (&p_Var10->_M_left)[(int)_Var3 < iVar11];
          } while ((&p_Var10->_M_left)[(int)_Var3 < iVar11] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var14 == p_Var2) goto LAB_002e82ec;
          if ((int)_Var3 < iVar11) {
            p_Var10 = p_Var13;
          }
          if (iVar11 < (int)p_Var10[1]._M_color) goto LAB_002e82ec;
          std::operator+(&local_c8,"\"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (lVar1 + 8));
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_108 = &local_f8;
          plVar8 = plVar7 + 2;
          if ((long *)*plVar7 == plVar8) {
            local_f8 = *plVar8;
            lStack_f0 = plVar7[3];
          }
          else {
            local_f8 = *plVar8;
            local_108 = (long *)*plVar7;
          }
          local_100 = plVar7[1];
          *plVar7 = (long)plVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          local_10c = *(key_type *)(lVar1 + 0x10);
          pmVar6 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_60,&local_10c);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_108,(ulong)(pmVar6->_M_dataplus)._M_p);
          local_98 = &local_88;
          plVar8 = plVar7 + 2;
          if ((long *)*plVar7 == plVar8) {
            local_88 = *plVar8;
            _Stack_80._M_p = (pointer)plVar7[3];
          }
          else {
            local_88 = *plVar8;
            local_98 = (long *)*plVar7;
          }
          local_90 = (char *)plVar7[1];
          *plVar7 = (long)plVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_e8.field_2._M_allocated_capacity = *psVar9;
            local_e8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar9;
            local_e8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_e8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108,local_f8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if (*(char *)(*(long *)(enm + 0x20) + 0x68) == '\0') {
            AddError(local_a0,*(string **)(enm + 8),&local_a8->super_Message,NUMBER,&local_e8);
          }
          else {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&local_98,LOGLEVEL_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1680);
            other = internal::LogMessage::operator<<((LogMessage *)&local_98,&local_e8);
            internal::LogFinisher::operator=((LogFinisher *)&local_108,other);
            internal::LogMessage::~LogMessage((LogMessage *)&local_98);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < *(int *)(enm + 0x2c));
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateEnumOptions(EnumDescriptor* enm,
                                            const EnumDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(enm, value, EnumValue);
  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    std::map<int, string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      if (used_values.find(enum_value->number()) != used_values.end()) {
        string error =
            "\"" + enum_value->full_name() +
            "\" uses the same enum value as \"" +
            used_values[enum_value->number()] + "\". If this is intended, set "
            "'option allow_alias = true;' to the enum definition.";
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          AddError(enm->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER,
                   error);
        } else {
          // Generate warning if duplicated values are found but the option
          // isn't set.
          GOOGLE_LOG(ERROR) << error;
        }
      } else {
        used_values[enum_value->number()] = enum_value->full_name();
      }
    }
  }
}